

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerReflection::execution_model_to_str_abi_cxx11_
          (string *__return_storage_ptr__,CompilerReflection *this,ExecutionModel model)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "vert";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "tesc";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "tese";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "geom";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "frag";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "comp";
    paVar1 = &local_e;
    break;
  default:
    switch((int)this) {
    case 0x14c1:
      pcVar2 = "rgen";
      paVar1 = &local_f;
      break;
    case 0x14c2:
      pcVar2 = "rint";
      paVar1 = &local_10;
      break;
    case 0x14c3:
      pcVar2 = "rahit";
      paVar1 = &local_11;
      break;
    case 0x14c4:
      pcVar2 = "rchit";
      paVar1 = &local_12;
      break;
    case 0x14c5:
      pcVar2 = "rmiss";
      paVar1 = &local_13;
      break;
    case 0x14c6:
      pcVar2 = "rcall";
      paVar1 = &local_14;
      break;
    default:
      pcVar2 = "???";
      paVar1 = &local_15;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

string CompilerReflection::execution_model_to_str(spv::ExecutionModel model)
{
	switch (model)
	{
	case ExecutionModelVertex:
		return "vert";
	case ExecutionModelTessellationControl:
		return "tesc";
	case ExecutionModelTessellationEvaluation:
		return "tese";
	case ExecutionModelGeometry:
		return "geom";
	case ExecutionModelFragment:
		return "frag";
	case ExecutionModelGLCompute:
		return "comp";
	case ExecutionModelRayGenerationNV:
		return "rgen";
	case ExecutionModelIntersectionNV:
		return "rint";
	case ExecutionModelAnyHitNV:
		return "rahit";
	case ExecutionModelClosestHitNV:
		return "rchit";
	case ExecutionModelMissNV:
		return "rmiss";
	case ExecutionModelCallableNV:
		return "rcall";
	default:
		return "???";
	}
}